

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# promp.cpp
# Opt level: O3

void __thiscall ProMP::ProMP(ProMP *this,MatrixXd *data,int numBf,double stdBf)

{
  int iVar1;
  double *pdVar2;
  double dVar3;
  Index IVar4;
  MatrixXd *pMVar5;
  double *local_30;
  double local_28;
  Index IStack_20;
  
  this->numBf_ = numBf;
  this->stdBf_ = stdBf;
  (this->means).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->means).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  (this->viaPoints_).
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->viaPoints_).
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->viaPoints_).
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->phase_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->phase_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0
  ;
  pMVar5 = data;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,__1,_0> *)&this->demoTrajs_,
             (DenseStorage<double,__1,__1,__1,_0> *)data);
  (this->stdW_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       0;
  (this->stdW_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       0;
  (this->meanW_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0
  ;
  (this->stdW_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (this->phaseDiff_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_cols = 0;
  (this->meanW_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->phaseDiff_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_data = (double *)0x0;
  (this->phaseDiff_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_rows = 0;
  (this->w_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  (this->w_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  (this->phi_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0
  ;
  (this->w_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (this->phi_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (this->phi_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0
  ;
  (this->numBfMid_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
       = (double *)0x0;
  (this->numBfMid_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
       = 0;
  iVar1 = (int)(this->demoTrajs_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_cols;
  this->numDemos_ =
       (int)(this->demoTrajs_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_rows;
  this->trajLength_ = iVar1;
  this->dt_ = 1.0 / (double)iVar1;
  linspace((ProMP *)&stack0xffffffffffffffd0,0.0,1.0,(int)pMVar5);
  pdVar2 = (this->numBfMid_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
           m_storage.m_data;
  (this->numBfMid_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
       = local_30;
  dVar3 = (double)(this->numBfMid_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_rows;
  (this->numBfMid_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
       = (Index)local_28;
  local_30 = pdVar2;
  local_28 = dVar3;
  free(pdVar2);
  computePhase(this,1.0);
  generateBasisFunction((MatrixXd *)&stack0xffffffffffffffd0,this,&this->phase_,this->trajLength_);
  pdVar2 = (this->phi_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data;
  (this->phi_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       local_30;
  dVar3 = (double)(this->phi_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_rows;
  IVar4 = (this->phi_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols;
  (this->phi_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       (Index)local_28;
  (this->phi_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       IStack_20;
  local_30 = pdVar2;
  local_28 = dVar3;
  IStack_20 = IVar4;
  free(pdVar2);
  train(this,data);
  return;
}

Assistant:

ProMP::ProMP(Eigen::MatrixXd& data,int numBf, double stdBf):demoTrajs_(data),numBf_(numBf),stdBf_(stdBf){
	numDemos_ = demoTrajs_.innerSize();
	trajLength_ = demoTrajs_.outerSize();
	dt_ = 1.0/trajLength_;
	numBfMid_ = linspace(0,1,numBf_);
	computePhase(1.0);
	phi_ = generateBasisFunction(phase_,trajLength_);
	train(data);
	}